

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DynamicRectMatrix.hpp
# Opt level: O3

DynamicRectMatrix<double> __thiscall
OpenMD::DynamicRectMatrix<double>::operator=
          (DynamicRectMatrix<double> *this,DynamicRectMatrix<double> *m)

{
  uint uVar1;
  double **ppdVar2;
  double **ppdVar3;
  double *pdVar4;
  double *pdVar5;
  DynamicRectMatrix<double> *in_RDX;
  undefined8 extraout_RDX;
  uint uVar6;
  ulong uVar7;
  ulong uVar8;
  DynamicRectMatrix<double> DVar9;
  
  if (m != in_RDX) {
    uVar6 = m->nrow_;
    if ((uVar6 != in_RDX->nrow_) || (m->ncol_ != in_RDX->ncol_)) {
      deallocate(m);
      allocate(m,in_RDX->nrow_,in_RDX->ncol_);
      uVar6 = m->nrow_;
    }
    if (uVar6 != 0) {
      uVar1 = m->ncol_;
      ppdVar2 = in_RDX->data_;
      ppdVar3 = m->data_;
      uVar7 = 0;
      do {
        if ((ulong)uVar1 != 0) {
          pdVar4 = ppdVar2[uVar7];
          pdVar5 = ppdVar3[uVar7];
          uVar8 = 0;
          do {
            pdVar5[uVar8] = pdVar4[uVar8];
            uVar8 = uVar8 + 1;
          } while (uVar1 != uVar8);
        }
        uVar7 = uVar7 + 1;
      } while (uVar7 != uVar6);
    }
  }
  DynamicRectMatrix(this,m);
  DVar9.nrow_ = (int)extraout_RDX;
  DVar9.ncol_ = (int)((ulong)extraout_RDX >> 0x20);
  DVar9.data_ = (double **)this;
  return DVar9;
}

Assistant:

DynamicRectMatrix<Real> operator=(const DynamicRectMatrix<Real>& m) {
      if (this == &m) return *this;
      if (nrow_ != m.getNRow() || ncol_ != m.getNCol()) {
        deallocate();
        allocate(m.getNRow(), m.getNCol());
      }

      for (unsigned int i = 0; i < nrow_; i++)
        for (unsigned int j = 0; j < ncol_; j++)
          this->data_[i][j] = m.data_[i][j];
      return *this;
    }